

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtptngen.cpp
# Opt level: O0

int32_t __thiscall
icu_63::DateTimePatternGenerator::getTopBitNumber(DateTimePatternGenerator *this,int32_t foundMask)

{
  undefined4 local_20;
  undefined4 local_1c;
  int32_t i;
  int32_t foundMask_local;
  DateTimePatternGenerator *this_local;
  
  if (foundMask == 0) {
    this_local._4_4_ = 0;
  }
  else {
    local_20 = 0;
    for (local_1c = foundMask; local_1c != 0; local_1c = local_1c >> 1) {
      local_20 = local_20 + 1;
    }
    if (local_20 + -1 < 0x10) {
      this_local._4_4_ = local_20 + -1;
    }
    else {
      this_local._4_4_ = 0xf;
    }
  }
  return this_local._4_4_;
}

Assistant:

int32_t
DateTimePatternGenerator::getTopBitNumber(int32_t foundMask) const {
    if ( foundMask==0 ) {
        return 0;
    }
    int32_t i=0;
    while (foundMask!=0) {
        foundMask >>=1;
        ++i;
    }
    if (i-1 >UDATPG_ZONE_FIELD) {
        return UDATPG_ZONE_FIELD;
    }
    else
        return i-1;
}